

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Token * __thiscall toml::internal::Lexer::nextValue(Token *__return_storage_ptr__,Lexer *this)

{
  ulong uVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  int64_t x;
  string s;
  stringstream ss;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  string local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ios_base local_138 [264];
  
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  iVar6 = std::istream::peek();
  if ((iVar6 == -1) || (iVar6 = isalpha((int)(char)iVar6), iVar6 == 0)) {
    while ((uVar7 = std::istream::peek(), sVar3 = local_1d8._M_string_length,
           _Var2._M_p = local_1d8._M_dataplus._M_p, uVar7 != 0xffffffff &&
           (((byte)((char)uVar7 - 0x30U) < 10 ||
            ((uVar7 = (uVar7 & 0xff) - 0x2b, uVar7 < 0x3b &&
             ((0x41082000400800dU >> ((ulong)uVar7 & 0x3f) & 1) != 0))))))) {
      iVar6 = std::istream::get();
      if (iVar6 == 10) {
        this->lineNo_ = this->lineNo_ + 1;
      }
      std::__cxx11::string::push_back((char)&local_1d8);
    }
    if (local_1d8._M_string_length != 0) {
      uVar9 = 1;
      uVar4 = (ulong)((*local_1d8._M_dataplus._M_p - 0x2bU & 0xfd) == 0);
joined_r0x00133605:
      uVar1 = uVar4;
      if ((uVar1 < local_1d8._M_string_length) &&
         (uVar9 = uVar1, (byte)(local_1d8._M_dataplus._M_p[uVar1] - 0x30U) < 10))
      goto code_r0x0013361b;
      if (uVar9 == local_1d8._M_string_length) {
        local_1f0 = 0;
        local_1e8 = 0;
        uVar9 = 0;
        local_1f8 = &local_1e8;
        do {
          if (_Var2._M_p[uVar9] != '_') {
            std::__cxx11::string::push_back((char)&local_1f8);
          }
          uVar9 = uVar9 + 1;
        } while (sVar3 != uVar9);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_1b8,(string *)&local_1f8,_S_out|_S_in);
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
        }
        std::istream::_M_extract<long>((long *)&local_1b8);
        __return_storage_ptr__->type_ = INT;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        (__return_storage_ptr__->str_value_)._M_string_length = 0;
        (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->int_value_ = (int64_t)local_1f8;
        (__return_storage_ptr__->time_value_).__d.__r = 0;
        goto LAB_00133889;
      }
    }
LAB_001337d1:
    bVar5 = isDouble(&local_1d8);
    sVar3 = local_1d8._M_string_length;
    _Var2._M_p = local_1d8._M_dataplus._M_p;
    if (bVar5) {
      local_1f0 = 0;
      local_1e8 = 0;
      local_1f8 = &local_1e8;
      if (local_1d8._M_string_length != 0) {
        uVar9 = 0;
        do {
          if (_Var2._M_p[uVar9] != '_') {
            std::__cxx11::string::push_back((char)&local_1f8);
          }
          uVar9 = uVar9 + 1;
        } while (sVar3 != uVar9);
      }
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&local_1b8,(string *)&local_1f8,_S_out|_S_in);
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
      }
      std::istream::_M_extract<double>((double *)&local_1b8);
      __return_storage_ptr__->type_ = DOUBLE;
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      (__return_storage_ptr__->str_value_)._M_string_length = 0;
      (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->double_value_ = (double)local_1f8;
      (__return_storage_ptr__->time_value_).__d.__r = 0;
LAB_00133889:
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      parseAsTime(__return_storage_ptr__,this,&local_1d8);
    }
  }
  else {
    std::__cxx11::string::push_back((char)&local_1d8);
    iVar6 = std::istream::get();
    if (iVar6 == 10) {
      this->lineNo_ = this->lineNo_ + 1;
    }
    while ((iVar6 = std::istream::peek(), iVar6 != -1 &&
           (iVar6 = isalpha((int)(char)iVar6), iVar6 != 0))) {
      std::__cxx11::string::push_back((char)&local_1d8);
      iVar6 = std::istream::get();
      if (iVar6 == 10) {
        this->lineNo_ = this->lineNo_ + 1;
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_1d8);
    if (iVar6 == 0) {
      __return_storage_ptr__->type_ = BOOL;
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      (__return_storage_ptr__->str_value_)._M_string_length = 0;
      (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->int_value_ = 1;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_1d8);
      if (iVar6 != 0) {
        local_1f8 = &local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Unknown ident: ","");
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1f8,(ulong)local_1d8._M_dataplus._M_p);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_1a8 = *plVar10;
          uStack_1a0 = (undefined4)plVar8[3];
          uStack_19c = *(undefined4 *)((long)plVar8 + 0x1c);
          local_1b8 = &local_1a8;
        }
        else {
          local_1a8 = *plVar10;
          local_1b8 = (long *)*plVar8;
        }
        local_1b0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        __return_storage_ptr__->type_ = ERROR_TOKEN;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_1b8,
                   local_1b0 + (long)local_1b8);
        (__return_storage_ptr__->time_value_).__d.__r = 0;
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8 + 1);
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
        }
        goto LAB_0013392f;
      }
      __return_storage_ptr__->type_ = BOOL;
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      (__return_storage_ptr__->str_value_)._M_string_length = 0;
      (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->int_value_ = 0;
    }
    (__return_storage_ptr__->time_value_).__d.__r = 0;
  }
LAB_0013392f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
code_r0x0013361b:
  uVar9 = uVar1 + 1;
  uVar4 = uVar9;
  if (((uVar9 < local_1d8._M_string_length) && (local_1d8._M_dataplus._M_p[uVar9] == '_')) &&
     ((uVar9 = uVar1 + 2, local_1d8._M_string_length <= uVar9 ||
      (uVar4 = uVar9, 9 < (byte)(local_1d8._M_dataplus._M_p[uVar9] - 0x30U))))) goto LAB_001337d1;
  goto joined_r0x00133605;
}

Assistant:

inline Token Lexer::nextValue()
{
    std::string s;
    char c;

    if (current(&c) && isalpha(c)) {
        s += c;
        next();
        while (current(&c) && isalpha(c)) {
            s += c;
            next();
        }

        if (s == "true")
            return Token(TokenType::BOOL, true);
        if (s == "false")
            return Token(TokenType::BOOL, false);
        return Token(TokenType::ERROR_TOKEN, std::string("Unknown ident: ") + s);
    }

    while (current(&c) && (('0' <= c && c <= '9') || c == '.' || c == 'e' || c == 'E' ||
                           c == 'T' || c == 'Z' || c == '_' || c == ':' || c == '-' || c == '+')) {
        next();
        s += c;
    }

    if (isInteger(s)) {
        std::stringstream ss(removeDelimiter(s));
        std::int64_t x;
        ss >> x;
        return Token(TokenType::INT, x);
    }

    if (isDouble(s)) {
        std::stringstream ss(removeDelimiter(s));
        double d;
        ss >> d;
        return Token(TokenType::DOUBLE, d);
    }

    return parseAsTime(s);
}